

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryGetEntry(Impl *this,StringPtr name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  const_iterator iter;
  Impl *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Impl *)name.content.ptr;
  iter._M_node = (_Base_ptr)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
       ::find(&this->entries,(key_type *)&this_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
       ::end(&this->entries);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::Maybe
              ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
               &name_local.content.size_,(void *)0x0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>
             ::operator->(&local_30);
    Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::Maybe
              ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
               &name_local.content.size_,&ppVar2->second);
  }
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)
         (EntryImpl *)name_local.content.size_;
}

Assistant:

kj::Maybe<const EntryImpl&> tryGetEntry(kj::StringPtr name) const {
      auto iter = entries.find(name);
      if (iter == entries.end()) {
        return nullptr;
      } else {
        return iter->second;
      }
    }